

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O3

void * __thiscall google::protobuf::internal::ExtensionSet::Extension::PrefetchPtr(Extension *this)

{
  if (((byte)(this->type - 9) < 4 | this->is_repeated) == (this->field_0xa & 1)) {
    if ((this->field_0xa & 1) != 0) {
      this = (Extension *)(this->field_0).int64_t_value;
    }
    return this;
  }
  PrefetchPtr();
}

Assistant:

const void* PrefetchPtr() const {
      ABSL_DCHECK_EQ(is_pointer, is_repeated || FieldTypeIsPointer(type));
      // We don't want to prefetch invalid/null pointers so if there isn't a
      // pointer to prefetch, then return `this`.
      return is_pointer ? absl::bit_cast<const void*>(ptr) : this;
    }